

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.c
# Opt level: O0

ztresult_t bandmember_saver(void *pvoidval,char *buf,size_t bufsz)

{
  char *in_RSI;
  long *in_RDI;
  int i;
  char **ppcharval;
  uint local_2c;
  ztresult_t local_4;
  
  for (local_2c = 0; (local_2c < 4 && (popular_beat_combo[(int)local_2c] != (char *)*in_RDI));
      local_2c = local_2c + 1) {
  }
  if (local_2c == 4) {
    local_4 = 0x80;
  }
  else {
    sprintf(in_RSI,"%d",(ulong)local_2c);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static ztresult_t bandmember_saver(const void *pvoidval,
                                   char       *buf,
                                   size_t      bufsz)
{
  const char **ppcharval = (const char **) pvoidval;
  int          i;

  for (i = 0; i < NELEMS(popular_beat_combo); i++)
    if (popular_beat_combo[i] == *ppcharval)
      break;
  if (i == NELEMS(popular_beat_combo))
    return ztresult_BAD_POINTER;

  sprintf(buf, "%d", i);
  return ztresult_OK;
}